

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_convert_int.c
# Opt level: O0

int mpt_data_convert_uint32(uint32_t *from,mpt_type_t type,void *dest)

{
  char cVar1;
  undefined1 uVar2;
  ushort **ppuVar3;
  iovec *vec;
  uint32_t val;
  void *dest_local;
  mpt_type_t type_local;
  uint32_t *from_local;
  
  vec._4_4_ = 0;
  if (from != (uint32_t *)0x0) {
    vec._4_4_ = *from;
  }
  dest_local = (void *)type;
  if (type == 0x6c) {
    cVar1 = mpt_type_int(8);
    dest_local = (void *)(long)cVar1;
  }
  uVar2 = (undefined1)vec._4_4_;
  switch(dest_local) {
  case (void *)0x55:
    if (dest == (void *)0x0) {
      from_local._4_4_ = -0x10;
    }
    else {
      *(uint32_t **)dest = from;
      *(undefined8 *)((long)dest + 8) = 4;
      from_local._4_4_ = 0x10;
    }
    break;
  default:
    from_local._4_4_ = -3;
    break;
  case (void *)0x62:
    if (vec._4_4_ < 0x80) {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar2;
      }
      from_local._4_4_ = 1;
    }
    else {
      from_local._4_4_ = -2;
    }
    break;
  case (void *)0x63:
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)vec._4_4_] & 0x8000) == 0) {
      from_local._4_4_ = -2;
    }
    else {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar2;
      }
      from_local._4_4_ = 1;
    }
    break;
  case (void *)0x64:
    if (dest != (void *)0x0) {
      *(double *)dest = (double)vec._4_4_;
    }
    from_local._4_4_ = 8;
    break;
  case (void *)0x65:
    if (dest != (void *)0x0) {
      *(longdouble *)dest = (longdouble)vec._4_4_;
    }
    from_local._4_4_ = 0x10;
    break;
  case (void *)0x66:
    if (dest != (void *)0x0) {
      *(float *)dest = (float)vec._4_4_;
    }
    from_local._4_4_ = 4;
    break;
  case (void *)0x69:
    if (0x7fffffff < vec._4_4_) {
      return -2;
    }
  case (void *)0x75:
    if (dest != (void *)0x0) {
      *(uint32_t *)dest = vec._4_4_;
    }
    from_local._4_4_ = 4;
    break;
  case (void *)0x6e:
    if (vec._4_4_ < 0x8000) {
      if (dest != (void *)0x0) {
        *(short *)dest = (short)vec._4_4_;
      }
      from_local._4_4_ = 2;
    }
    else {
      from_local._4_4_ = -2;
    }
    break;
  case (void *)0x71:
    if (vec._4_4_ < 0x10000) {
      if (dest != (void *)0x0) {
        *(short *)dest = (short)vec._4_4_;
      }
      from_local._4_4_ = 2;
    }
    else {
      from_local._4_4_ = -2;
    }
    break;
  case (void *)0x74:
  case (void *)0x78:
    if (dest != (void *)0x0) {
      *(ulong *)dest = (ulong)vec._4_4_;
    }
    from_local._4_4_ = 8;
    break;
  case (void *)0x79:
    if (vec._4_4_ < 0x100) {
      if (dest != (void *)0x0) {
        *(undefined1 *)dest = uVar2;
      }
      from_local._4_4_ = 1;
    }
    else {
      from_local._4_4_ = -2;
    }
  }
  return from_local._4_4_;
}

Assistant:

extern int mpt_data_convert_uint32(const uint32_t *from, MPT_TYPE(type) type, void *dest)
{
	uint32_t val = 0;
	if (from) {
		val = *from;
	}
	if (type == 'l') {
		type = mpt_type_int(sizeof(long));
	}
	switch (type) {
		case 'c':
			if (!isgraph(val)) return MPT_ERROR(BadValue);
			if (dest) *((char *) dest) = val;
			return sizeof(char);
		case 'b':
			if (val > INT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int8_t *) dest) = val;
			return sizeof(int8_t);
		case 'y':
			if (val > UINT8_MAX) return MPT_ERROR(BadValue);
			if (dest) *((uint8_t *) dest) = val;
			return sizeof(uint8_t);
		case 'n':
			if (val > INT16_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int16_t *) dest) = val;
			return sizeof(int16_t);
		case 'q':
			if (val > UINT16_MAX) return MPT_ERROR(BadValue);
			if (dest) *((int16_t *) dest) = val;
			return sizeof(int16_t);
		case 'i':
			if (val > INT32_MAX) return MPT_ERROR(BadValue);
			/* fall through */
		case 'u':
			if (dest) *((uint32_t *) dest) = val;
			return sizeof(uint32_t);
		case 't':
		case 'x':
			if (dest) *((int64_t *) dest) = val;
			return sizeof(int64_t);
		
		case 'f':
			if (dest) *((float *) dest) = val;
			return sizeof(float);
		case 'd':
			if (dest) *((double *) dest) = val;
			return sizeof(double);
#ifdef _MPT_FLOAT_EXTENDED_H
		case 'e':
			if (dest) *((long double *) dest) = val;
			return sizeof(long double);
#endif
		case MPT_type_toVector('u'):
			if (dest) {
				struct iovec *vec = dest;
				vec->iov_base = (void *) from;
				vec->iov_len  = sizeof(*from);
				return sizeof(*vec);
			}
			return MPT_ERROR(MissingData);
		default:
			/* invalid conversion */
			return MPT_ERROR(BadType);
	}
}